

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_check_pub_priv
              (mbedtls_ecp_keypair *pub,mbedtls_ecp_keypair *prv,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_ecp_group_id mVar1;
  int iVar2;
  mbedtls_mpi *Y;
  mbedtls_mpi *Y_00;
  undefined1 local_138 [8];
  mbedtls_ecp_group grp;
  mbedtls_ecp_point Q;
  
  mVar1 = (pub->grp).id;
  if (mVar1 == MBEDTLS_ECP_DP_NONE) {
    return -0x4f80;
  }
  if (mVar1 != (prv->grp).id) {
    return -0x4f80;
  }
  Q.Z._8_8_ = p_rng;
  iVar2 = mbedtls_mpi_cmp_mpi(&(pub->Q).X,&(prv->Q).X);
  if (iVar2 != 0) {
    return -0x4f80;
  }
  Y = &(prv->Q).Y;
  iVar2 = mbedtls_mpi_cmp_mpi(&(pub->Q).Y,Y);
  if (iVar2 == 0) {
    Y_00 = &(prv->Q).Z;
    iVar2 = mbedtls_mpi_cmp_mpi(&(pub->Q).Z,Y_00);
    if (iVar2 == 0) {
      mbedtls_ecp_point_init((mbedtls_ecp_point *)&grp.T_size);
      mbedtls_ecp_group_init((mbedtls_ecp_group *)local_138);
      mbedtls_ecp_group_copy((mbedtls_ecp_group *)local_138,&prv->grp);
      iVar2 = mbedtls_ecp_mul((mbedtls_ecp_group *)local_138,(mbedtls_ecp_point *)&grp.T_size,
                              &prv->d,&(prv->grp).G,f_rng,(void *)Q.Z._8_8_);
      if (iVar2 == 0) {
        iVar2 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&grp.T_size,&(prv->Q).X);
        if (((iVar2 == 0) && (iVar2 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&Q.X.s,Y), iVar2 == 0)) &&
           (iVar2 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&Q.Y.s,Y_00), iVar2 == 0)) {
          iVar2 = 0;
        }
        else {
          iVar2 = -0x4f80;
        }
      }
      mbedtls_ecp_point_free((mbedtls_ecp_point *)&grp.T_size);
      mbedtls_ecp_group_free((mbedtls_ecp_group *)local_138);
      return iVar2;
    }
    return -0x4f80;
  }
  return -0x4f80;
}

Assistant:

int mbedtls_ecp_check_pub_priv(
    const mbedtls_ecp_keypair *pub, const mbedtls_ecp_keypair *prv,
    int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_point Q;
    mbedtls_ecp_group grp;
    if (pub->grp.id == MBEDTLS_ECP_DP_NONE ||
        pub->grp.id != prv->grp.id ||
        mbedtls_mpi_cmp_mpi(&pub->Q.X, &prv->Q.X) ||
        mbedtls_mpi_cmp_mpi(&pub->Q.Y, &prv->Q.Y) ||
        mbedtls_mpi_cmp_mpi(&pub->Q.Z, &prv->Q.Z)) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    mbedtls_ecp_point_init(&Q);
    mbedtls_ecp_group_init(&grp);

    /* mbedtls_ecp_mul() needs a non-const group... */
    mbedtls_ecp_group_copy(&grp, &prv->grp);

    /* Also checks d is valid */
    MBEDTLS_MPI_CHK(mbedtls_ecp_mul(&grp, &Q, &prv->d, &prv->grp.G, f_rng, p_rng));

    if (mbedtls_mpi_cmp_mpi(&Q.X, &prv->Q.X) ||
        mbedtls_mpi_cmp_mpi(&Q.Y, &prv->Q.Y) ||
        mbedtls_mpi_cmp_mpi(&Q.Z, &prv->Q.Z)) {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

cleanup:
    mbedtls_ecp_point_free(&Q);
    mbedtls_ecp_group_free(&grp);

    return ret;
}